

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

char * ImGui::SaveIniSettingsToMemory(size_t *out_size)

{
  ImGuiContext *pIVar1;
  int iVar2;
  char *pcVar3;
  long *in_RDI;
  ImGuiSettingsHandler *handler;
  int handler_n;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  ImGuiSettingsHandler *in_stack_ffffffffffffffe0;
  int local_18;
  
  pIVar1 = GImGui;
  GImGui->SettingsDirtyTimer = 0.0;
  ImVector<char>::resize((ImVector<char> *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  ImVector<char>::push_back
            ((ImVector<char> *)in_stack_ffffffffffffffe0,
             (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  for (local_18 = 0; local_18 < (pIVar1->SettingsHandlers).Size; local_18 = local_18 + 1) {
    in_stack_ffffffffffffffe0 =
         ImVector<ImGuiSettingsHandler>::operator[]
                   ((ImVector<ImGuiSettingsHandler> *)in_stack_ffffffffffffffe0,
                    in_stack_ffffffffffffffdc);
    (*in_stack_ffffffffffffffe0->WriteAllFn)
              (pIVar1,in_stack_ffffffffffffffe0,&pIVar1->SettingsIniData);
  }
  if (in_RDI != (long *)0x0) {
    iVar2 = ImGuiTextBuffer::size(&pIVar1->SettingsIniData);
    *in_RDI = (long)iVar2;
  }
  pcVar3 = ImGuiTextBuffer::c_str(&pIVar1->SettingsIniData);
  return pcVar3;
}

Assistant:

const char* ImGui::SaveIniSettingsToMemory(size_t* out_size)
{
    ImGuiContext& g = *GImGui;
    g.SettingsDirtyTimer = 0.0f;
    g.SettingsIniData.Buf.resize(0);
    g.SettingsIniData.Buf.push_back(0);
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
    {
        ImGuiSettingsHandler* handler = &g.SettingsHandlers[handler_n];
        handler->WriteAllFn(&g, handler, &g.SettingsIniData);
    }
    if (out_size)
        *out_size = (size_t)g.SettingsIniData.size();
    return g.SettingsIniData.c_str();
}